

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

deUint32 rr::anon_unknown_19::readIndexArray(IndexType type,void *ptr,size_t ndx)

{
  deUint32 dVar1;
  
  if (type == INDEXTYPE_UINT32) {
    dVar1 = *(deUint32 *)((long)ptr + ndx * 4);
  }
  else {
    if (type == INDEXTYPE_UINT16) {
      return (deUint32)*(ushort *)((long)ptr + ndx * 2);
    }
    dVar1 = 0;
    if (type == INDEXTYPE_UINT8) {
      return (deUint32)*(byte *)((long)ptr + ndx);
    }
  }
  return dVar1;
}

Assistant:

deUint32 readIndexArray (const IndexType type, const void* ptr, size_t ndx)
{
	switch (type)
	{
		case INDEXTYPE_UINT8:
			return ((const deUint8*)ptr)[ndx];

		case INDEXTYPE_UINT16:
		{
			deUint16 retVal;
			deMemcpy(&retVal, (const deUint8*)ptr + ndx * sizeof(deUint16), sizeof(deUint16));

			return retVal;
		}

		case INDEXTYPE_UINT32:
		{
			deUint32 retVal;
			deMemcpy(&retVal, (const deUint8*)ptr + ndx * sizeof(deUint32), sizeof(deUint32));

			return retVal;
		}

		default:
			DE_ASSERT(false);
			return 0;
	}
}